

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

bool __thiscall cmOrderDirectories::IsSameDirectory(cmOrderDirectories *this,string *l,string *r)

{
  __type _Var1;
  string *__lhs;
  string *__rhs;
  string *r_local;
  string *l_local;
  cmOrderDirectories *this_local;
  
  __lhs = GetRealPath(this,l);
  __rhs = GetRealPath(this,r);
  _Var1 = std::operator==(__lhs,__rhs);
  return _Var1;
}

Assistant:

bool cmOrderDirectories::IsSameDirectory(std::string const& l,
                                         std::string const& r)
{
  return this->GetRealPath(l) == this->GetRealPath(r);
}